

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  int *piVar1;
  uint uVar2;
  Value VVar3;
  undefined8 uVar4;
  uint uVar5;
  bool bVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  Node *pNVar10;
  Node *pNVar11;
  Node *pNVar12;
  TValue *pTVar13;
  long lVar14;
  int lg;
  uint uVar15;
  int iVar16;
  uint ause;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  char *fmt;
  uint uVar21;
  uint uVar22;
  Node *pNVar23;
  Value *nums;
  int iVar24;
  lua_Integer k;
  TValue aux;
  Value local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Value local_40;
  undefined4 local_38;
  
  if (key->tt_ == 3) {
    iVar17 = luaV_tointeger(key,&local_c8.i,0);
    if (iVar17 == 0) {
      if (NAN((key->value_).n)) {
        fmt = "table index is NaN";
        goto LAB_00121253;
      }
    }
    else {
      key = (TValue *)&local_40;
      local_40 = local_c8;
      local_38 = 0x13;
    }
  }
  else if (key->tt_ == 0) {
    fmt = "table index is nil";
LAB_00121253:
    luaG_runerror(L,fmt);
  }
  pNVar10 = mainposition(t,key);
  if (((pNVar10->i_val).tt_ != 0) || (t->lastfree == (Node *)0x0)) {
    if (t->lastfree == (Node *)0x0) {
LAB_00120f87:
      pNVar23 = (Node *)0x0;
    }
    else {
      pNVar11 = t->lastfree;
      do {
        if (pNVar11 <= t->node) goto LAB_00120f87;
        pNVar23 = pNVar11 + -1;
        t->lastfree = pNVar23;
        pNVar12 = pNVar11 + -1;
        pNVar11 = pNVar23;
      } while ((pNVar12->i_key).nk.tt_ != 0);
    }
    if (pNVar23 == (Node *)0x0) {
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8.gc = (GCObject *)0x0;
      uStack_c0 = 0;
      uVar9 = t->sizearray;
      lVar14 = 0;
      uVar15 = 1;
      iVar17 = 0;
      uVar19 = 1;
      do {
        uVar21 = uVar19;
        if ((uVar9 < uVar19) && (uVar21 = uVar9, uVar9 < uVar15)) {
          bVar6 = false;
        }
        else {
          iVar16 = 0;
          uVar20 = uVar15;
          if (uVar15 <= uVar21) {
            uVar20 = uVar21 + 1;
            if (uVar21 + 1 < uVar15 + 1) {
              uVar20 = uVar15 + 1;
            }
            uVar15 = uVar15 - 1;
            iVar16 = 0;
            do {
              iVar16 = (iVar16 + 1) - (uint)(t->array[uVar15].tt_ == 0);
              iVar24 = uVar15 - uVar20;
              uVar15 = uVar15 + 1;
            } while (iVar24 != -2);
          }
          piVar1 = (int *)((long)&local_c8 + lVar14 * 4);
          *piVar1 = *piVar1 + iVar16;
          iVar17 = iVar17 + iVar16;
          bVar6 = true;
          uVar15 = uVar20;
        }
        if (!bVar6) break;
        lVar14 = lVar14 + 1;
        uVar19 = uVar19 * 2;
      } while (lVar14 != 0x20);
      uVar18 = (ulong)(uint)~(-1 << (t->lsizenode & 0x1f)) << 5 | 0x10;
      iVar24 = 0;
      iVar16 = 0;
      do {
        if (*(int *)((long)t->node + (uVar18 - 8)) != 0) {
          iVar8 = countint((TValue *)((long)&(t->node->i_val).value_ + uVar18),(uint *)&local_c8.b);
          iVar16 = iVar16 + iVar8;
          iVar24 = iVar24 + 1;
        }
        uVar18 = uVar18 - 0x20;
      } while (uVar18 != 0xfffffffffffffff0);
      nums = &local_c8;
      iVar8 = countint(key,(uint *)&nums->b);
      uVar9 = iVar8 + iVar16 + iVar17;
      if (uVar9 == 0) {
        uVar19 = 0;
        uVar15 = 0;
      }
      else {
        uVar20 = 0;
        uVar15 = 0;
        uVar19 = 0;
        uVar22 = 0;
        uVar21 = 1;
        do {
          uVar22 = uVar22 + nums->b;
          uVar2 = uVar15;
          uVar5 = uVar19;
          if (uVar20 < uVar22) {
            uVar2 = uVar21;
            uVar5 = uVar22;
          }
          if (nums->b != 0) {
            uVar15 = uVar2;
            uVar19 = uVar5;
          }
          uVar20 = uVar21 & 0x7fffffff;
          nums = (Value *)(&nums->b + 1);
          uVar21 = uVar21 * 2;
        } while (uVar20 < uVar9);
      }
      luaH_resize(L,t,uVar15,((iVar17 + iVar24) - uVar19) + 1);
      pTVar13 = luaH_set(L,t,key);
    }
    else {
      pNVar11 = mainposition(t,&(pNVar10->i_key).tvk);
      if (pNVar11 == pNVar10) {
        lVar14 = (long)(pNVar10->i_key).nk.next;
        if (lVar14 != 0) {
          (pNVar23->i_key).nk.next =
               (int)((ulong)((long)pNVar10 + (lVar14 * 0x20 - (long)pNVar23)) >> 5);
        }
        pTVar13 = (TValue *)((ulong)((long)pNVar23 - (long)pNVar10) >> 5);
        (pNVar10->i_key).nk.next = (int)pTVar13;
        pNVar10 = pNVar23;
      }
      else {
        do {
          pNVar12 = pNVar11;
          pNVar11 = pNVar12 + (pNVar12->i_key).nk.next;
        } while (pNVar12 + (pNVar12->i_key).nk.next != pNVar10);
        pTVar13 = (TValue *)((ulong)((long)pNVar23 - (long)pNVar12) >> 5);
        (pNVar12->i_key).nk.next = (int)pTVar13;
        VVar3 = (pNVar10->i_val).value_;
        iVar17 = (pNVar10->i_val).tt_;
        uVar7 = *(undefined4 *)&(pNVar10->i_val).field_0xc;
        uVar4 = *(undefined8 *)((long)&pNVar10->i_key + 8);
        (pNVar23->i_key).nk.value_ = (pNVar10->i_key).nk.value_;
        *(undefined8 *)((long)&pNVar23->i_key + 8) = uVar4;
        (pNVar23->i_val).value_ = VVar3;
        (pNVar23->i_val).tt_ = iVar17;
        *(undefined4 *)&(pNVar23->i_val).field_0xc = uVar7;
        if ((pNVar10->i_key).nk.next != 0) {
          pTVar13 = (TValue *)((ulong)((long)pNVar10 - (long)pNVar23) >> 5);
          piVar1 = &(pNVar23->i_key).nk.next;
          *piVar1 = *piVar1 + (int)pTVar13;
          (pNVar10->i_key).nk.next = 0;
        }
        (pNVar10->i_val).tt_ = 0;
      }
    }
    if (pNVar23 == (Node *)0x0) {
      return pTVar13;
    }
  }
  (pNVar10->i_key).nk.value_ = key->value_;
  (pNVar10->i_key).nk.tt_ = ((Value *)((long)key + 8))->b;
  if (((((ulong)*(Value *)((long)key + 8) & 0x40) != 0) && ((t->marked & 4) != 0)) &&
     (((*(GCObject **)key)->marked & 3) != 0)) {
    luaC_barrierback_(L,t);
  }
  return &pNVar10->i_val;
}

Assistant:

TValue *luaH_newkey (lua_State *L, Table *t, const TValue *key) {
  Node *mp;
  TValue aux;
  if (unlikely(ttisnil(key)))
    luaG_runerror(L, "table index is nil");
  else if (ttisfloat(key)) {
    lua_Number f = fltvalue(key);
    lua_Integer k;
    if (luaV_flttointeger(f, &k, F2Ieq)) {  /* does key fit in an integer? */
      setivalue(&aux, k);
      key = &aux;  /* insert it as an integer */
    }
    else if (unlikely(luai_numisnan(f)))
      luaG_runerror(L, "table index is NaN");
  }
  mp = mainpositionTV(t, key);
  if (!isempty(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' takes care of TM cache */
      return luaH_set(L, t, key);  /* insert key into grown table */
    }
    lua_assert(!isdummy(t));
    othern = mainposition(t, keytt(mp), &keyval(mp));
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setempty(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(L, mp, key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(isempty(gval(mp)));
  return gval(mp);
}